

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O2

Vec_Int_t * Gia_IsoCollectData(Gia_Man_t *p,Vec_Int_t *vObjs)

{
  int v;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar1;
  int i;
  
  p_00 = Vec_IntAlloc(vObjs->nSize);
  i = 0;
  while( true ) {
    if (vObjs->nSize <= i) {
      return p_00;
    }
    v = Vec_IntEntry(vObjs,i);
    pGVar1 = Gia_ManObj(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p_00,pGVar1->Value);
    i = i + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_IsoCollectData( Gia_Man_t * p, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj;  int i;
    Vec_Int_t * vData = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        Vec_IntPush( vData, pObj->Value );
    return vData;
}